

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *this_00;
  XmlOutput *v;
  XmlOutput *toTag;
  XmlOutput *o;
  XmlOutput *this_01;
  undefined4 in_register_00000034;
  xml_output *this_02;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffffc38;
  QStringList *in_stack_fffffffffffffc40;
  QString *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc68;
  char *ch;
  xml_output *in_stack_fffffffffffffc78;
  XmlOutput *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffce8;
  char *name;
  char local_100 [248];
  long local_8;
  
  this_02 = (xml_output *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_fffffffffffffc38,in_stack_fffffffffffffc68);
  tag(in_stack_fffffffffffffc48);
  this_00 = XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  ch = ";";
  attrTagX(in_stack_fffffffffffffce8,in_stack_fffffffffffffc40,(char *)this_00);
  v = XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  attrTagX(in_stack_fffffffffffffce8,(QStringList *)v,(char *)this_00);
  toTag = XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  name = local_100;
  attrTagX(name,(QStringList *)v,(char *)this_00);
  XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  attrTagX(name,(QStringList *)v,(char *)this_00);
  XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  attrTagX(name,(QStringList *)v,(char *)this_00);
  XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  attrTagX(name,(QStringList *)v,(char *)this_00);
  o = XmlOutput::operator<<(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  attrTagS((char *)this_00,(QString *)this_02);
  this_01 = XmlOutput::operator<<(in_stack_fffffffffffffc80,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  QString::QString((QString *)this_00,ch);
  closetag((QString *)toTag);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x248dba);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x248e56);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Lib)
            << attrTagX(_AdditionalDependencies, tool.AdditionalDependencies, ";")
            << attrTagX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagX(_ExportNamedFunctions, tool.ExportNamedFunctions, ";")
            << attrTagX(_ForceSymbolReferences, tool.ForceSymbolReferences, ";")
            << attrTagT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrTagX(_IgnoreSpecificDefaultLibraries, tool.IgnoreDefaultLibraryNames, ";")
            << attrTagS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrTagS(_OutputFile, tool.OutputFile)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Lib);
}